

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall RandomBotStrategy::reinforceMaxCards(RandomBotStrategy *this,CardType param_2)

{
  vector<CardType,_std::allocator<CardType>_> *pvVar1;
  result_type_conflict rVar2;
  uint uVar3;
  pointer pCVar4;
  uniform_int_distribution<int> dis;
  param_type local_8;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
  uVar3 = 0;
  for (pCVar4 = (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pCVar4 != (pvVar1->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_finish; pCVar4 = pCVar4 + 1) {
    uVar3 = uVar3 + (*pCVar4 == param_2);
  }
  local_8 = (param_type)((ulong)uVar3 << 0x20);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_8,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008,&local_8);
  return rVar2;
}

Assistant:

int RandomBotStrategy::reinforceMaxCards(std::mt19937 gen, int currentType) {
    int numberCurrentType = 0;
    for (CardType currentCard : *player->getCards()->getHand()) {
        if (currentCard == currentType) {
            numberCurrentType++;
        }
    }
    std::uniform_int_distribution<> dis(0, numberCurrentType);
    return dis(gen);
}